

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::NegativeTexureSampleCase::iterate
          (NegativeTexureSampleCase *this)

{
  int iVar1;
  GLenum err;
  deUint32 texture_00;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  GLenum value;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_210;
  GetNameFunc local_200;
  int local_1f8;
  Enum<int,_2UL> local_1f0;
  MessageBuilder local_1e0;
  GLint local_60;
  int local_5c;
  int maxSamples;
  int samples;
  GLenum error;
  undefined1 local_48 [8];
  Texture texture;
  CallLogWrapper gl;
  GLenum expectedError;
  NegativeTexureSampleCase *this_local;
  
  value = (this->m_sampleParam == SAMPLECOUNT_HIGH) + 0x501;
  pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)&texture.super_ObjectWrapper.m_object,
             (Functions *)CONCAT44(extraout_var,iVar1),pTVar3);
  pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)local_48,pRVar2);
  local_5c = -1;
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)&texture.super_ObjectWrapper.m_object,true);
  if (this->m_sampleParam == SAMPLECOUNT_HIGH) {
    local_60 = 0;
    glu::CallLogWrapper::glGetInternalformativ
              ((CallLogWrapper *)&texture.super_ObjectWrapper.m_object,0x9100,0x8058,0x80a9,1,
               &local_60);
    err = glu::CallLogWrapper::glGetError((CallLogWrapper *)&texture.super_ObjectWrapper.m_object);
    glu::checkError(err,"glGetInternalformativ",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                    ,0x7e2);
    local_5c = local_60 + 1;
  }
  else if (this->m_sampleParam == SAMPLECOUNT_ZERO) {
    local_5c = 0;
  }
  texture_00 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_48);
  glu::CallLogWrapper::glBindTexture
            ((CallLogWrapper *)&texture.super_ObjectWrapper.m_object,0x9100,texture_00);
  glu::CallLogWrapper::glTexStorage2DMultisample
            ((CallLogWrapper *)&texture.super_ObjectWrapper.m_object,0x9100,local_5c,0x8058,0x40,
             0x40,'\0');
  maxSamples = glu::CallLogWrapper::glGetError
                         ((CallLogWrapper *)&texture.super_ObjectWrapper.m_object);
  if (maxSamples == value) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1e0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1e0,(char (*) [23])"Got unexpected error: ");
    EVar5 = glu::getErrorStr(maxSamples);
    local_200 = EVar5.m_getName;
    local_1f8 = EVar5.m_value;
    local_1f0.m_getName = local_200;
    local_1f0.m_value = local_1f8;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1f0);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [13])", expected: ");
    EVar5 = glu::getErrorStr(value);
    local_210.m_getName = EVar5.m_getName;
    local_210.m_value = EVar5.m_value;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_210);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e0);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Got wrong error code");
  }
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)local_48);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)&texture.super_ObjectWrapper.m_object);
  return STOP;
}

Assistant:

NegativeTexureSampleCase::IterateResult NegativeTexureSampleCase::iterate (void)
{
	const glw::GLenum		expectedError	= (m_sampleParam == SAMPLECOUNT_HIGH) ? (GL_INVALID_OPERATION) : (GL_INVALID_VALUE);
	glu::CallLogWrapper		gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::Texture			texture			(m_context.getRenderContext());
	glw::GLenum				error;
	int						samples			= -1;

	gl.enableLogging(true);

	// calc samples

	if (m_sampleParam == SAMPLECOUNT_HIGH)
	{
		int maxSamples = 0;

		gl.glGetInternalformativ(GL_TEXTURE_2D_MULTISAMPLE, GL_RGBA8, GL_SAMPLES, 1, &maxSamples);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetInternalformativ");

		samples = maxSamples + 1;
	}
	else if (m_sampleParam == SAMPLECOUNT_ZERO)
		samples = 0;
	else
		DE_ASSERT(DE_FALSE);

	// create texture with bad values

	gl.glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, *texture);
	gl.glTexStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, samples, GL_RGBA8, 64, 64, GL_FALSE);
	error = gl.glGetError();

	// expect failure

	if (error == expectedError)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Got unexpected error: " << glu::getErrorStr(error) << ", expected: " << glu::getErrorStr(expectedError) << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got wrong error code");
	}

	return STOP;
}